

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void UnaryExpression_predec_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_70 [8];
  JsValue v0;
  JsValue r2;
  JsValue r1;
  JsAstUnaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&v0.u + 8));
  JsToNumber((JsValue *)((long)&v0.u + 8),res);
  (res->u).number = (res->u).number + -1.0;
  JsPutValue((JsValue *)((long)&r2.u + 8),res,(JsValue *)local_70);
  return;
}

Assistant:

static void
UnaryExpression_predec_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2,v0;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToNumber( &r2, res);
	res->u.number--;
	JsPutValue( &r1, res,&v0);
}